

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O3

void dsdKernelComputeSumOfComponents
               (Dsd_Manager_t *pDsdMan,Dsd_Node_t **pCommon,int nCommon,DdNode **pCompF,
               DdNode **pCompS,int fExor)

{
  DdNode *pDVar1;
  DdNode *n;
  Dsd_Node_t *pDVar2;
  DdNode *n_00;
  DdNode *n_01;
  ulong uVar3;
  
  n_01 = (DdNode *)((ulong)pDsdMan->pRoots ^ 1);
  Cudd_Ref(n_01);
  if (pCompS == (DdNode **)0x0) {
    n_00 = (DdNode *)0x0;
  }
  else {
    n_00 = (DdNode *)pDsdMan->pRoots;
    Cudd_Ref(n_00);
  }
  if (0 < nCommon) {
    uVar3 = 0;
    do {
      pDVar2 = (Dsd_Node_t *)((ulong)pCommon[uVar3] & 0xfffffffffffffffe);
      pDVar1 = (DdNode *)((ulong)pDVar2->G ^ 1);
      if (pCommon[uVar3] == pDVar2) {
        pDVar1 = pDVar2->G;
      }
      if (fExor == 0) {
        pDVar1 = Cudd_bddOr((DdManager *)pDsdMan,n_01,pDVar1);
      }
      else {
        pDVar1 = Cudd_bddXor((DdManager *)pDsdMan,n_01,pDVar1);
      }
      Cudd_Ref(pDVar1);
      Cudd_RecursiveDeref((DdManager *)pDsdMan,n_01);
      n = n_00;
      if (pCompS != (DdNode **)0x0) {
        n = Cudd_bddAnd((DdManager *)pDsdMan,n_00,pDVar2->S);
        Cudd_Ref(n);
        Cudd_RecursiveDeref((DdManager *)pDsdMan,n_00);
      }
      uVar3 = uVar3 + 1;
      n_00 = n;
      n_01 = pDVar1;
    } while ((uint)nCommon != uVar3);
    Cudd_Deref(pDVar1);
    *pCompF = pDVar1;
    if (pCompS != (DdNode **)0x0) {
      Cudd_Deref(n);
      *pCompS = n;
    }
    return;
  }
  __assert_fail("nCommon > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdProc.c"
                ,0x59f,
                "void dsdKernelComputeSumOfComponents(Dsd_Manager_t *, Dsd_Node_t **, int, DdNode **, DdNode **, int)"
               );
}

Assistant:

void dsdKernelComputeSumOfComponents( Dsd_Manager_t * pDsdMan, Dsd_Node_t ** pCommon, int nCommon, DdNode ** pCompF, DdNode ** pCompS, int fExor )
{
    DdManager * dd = pDsdMan->dd;
    DdNode * bF, * bFadd, * bTemp;
        DdNode * bS = NULL; // Suppress "might be used uninitialized"
    Dsd_Node_t * pDE, * pDER;
    int i;

    // start the function
    bF = b0; Cudd_Ref( bF );
    // start the support
    if ( pCompS )
        bS = b1, Cudd_Ref( bS );

    assert( nCommon > 0 );
    for ( i = 0; i < nCommon; i++ )
    {
        pDE  = pCommon[i];
        pDER = Dsd_Regular( pDE );
        bFadd = (pDE != pDER)? Cudd_Not(pDER->G): pDER->G;
        // add to the function
        if ( fExor )
            bF = Cudd_bddXor( dd, bTemp = bF, bFadd );
        else
            bF = Cudd_bddOr( dd, bTemp = bF, bFadd );
        Cudd_Ref( bF );
        Cudd_RecursiveDeref( dd, bTemp );
        if ( pCompS )
        {
            // add to the support
            bS = Cudd_bddAnd( dd, bTemp = bS, pDER->S );  Cudd_Ref( bS );
            Cudd_RecursiveDeref( dd, bTemp );
        }
    }
    // return the function
    Cudd_Deref( bF );
    *pCompF = bF;

    // return the support
    if ( pCompS )
        Cudd_Deref( bS ), *pCompS = bS;
}